

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O3

_Bool run_bitset_container_intersection
                (run_container_t *src_1,bitset_container_t *src_2,container_t **dst)

{
  ushort uVar1;
  ushort uVar2;
  rle16_t *prVar3;
  uint16_t *puVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  bitset_container_t *pbVar8;
  array_container_t *paVar9;
  byte bVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  rle16_t *runs;
  int32_t iVar14;
  uint32_t runValue;
  int iVar15;
  uint uVar16;
  int32_t n_runs;
  uint64_t *puVar17;
  long lVar18;
  
  uVar16 = src_1->n_runs;
  uVar12 = (ulong)uVar16;
  prVar3 = src_1->runs;
  if (((uVar12 == 1) && (prVar3->value == 0)) && (prVar3->length == 0xffff)) {
    if ((bitset_container_t *)*dst != src_2) {
      pbVar8 = bitset_container_clone(src_2);
      *dst = pbVar8;
      return true;
    }
    return true;
  }
  lVar18 = cpuid_Extended_Feature_Enumeration_info(7);
  if ((*(uint *)(lVar18 + 4) & 0x20) == 0) {
    uVar5 = uVar16;
    if ((int)uVar16 < 1) goto LAB_0010d694;
    uVar11 = 0;
    uVar13 = uVar12;
    do {
      uVar5 = (int)uVar13 + (uint)prVar3[uVar11].length;
      uVar13 = (ulong)uVar5;
      uVar11 = uVar11 + 1;
    } while (uVar12 != uVar11);
  }
  else {
    uVar5 = _avx2_run_container_cardinality(src_1);
  }
  if ((int)uVar5 < 0x1001) {
LAB_0010d694:
    uVar16 = src_2->cardinality;
    if ((int)uVar5 < src_2->cardinality) {
      uVar16 = uVar5;
    }
    paVar9 = array_container_create_given_capacity(uVar16);
    *dst = paVar9;
    if ((paVar9 != (array_container_t *)0x0) && (iVar7 = src_1->n_runs, 0 < (long)iVar7)) {
      prVar3 = src_1->runs;
      puVar4 = paVar9->array;
      puVar17 = src_2->words;
      iVar14 = paVar9->cardinality;
      lVar18 = 0;
      do {
        uVar12 = (ulong)prVar3[lVar18].value;
        iVar15 = prVar3[lVar18].length + 1;
        do {
          puVar4[iVar14] = (uint16_t)uVar12;
          iVar14 = iVar14 + (uint)((*(ulong *)((long)puVar17 + (ulong)((uint)(uVar12 >> 3) & 0x1ff8)
                                              ) >> (uVar12 & 0x3f) & 1) != 0);
          uVar12 = (ulong)((int)uVar12 + 1);
          iVar15 = iVar15 + -1;
        } while (iVar15 != 0);
        lVar18 = lVar18 + 1;
      } while (lVar18 != iVar7);
      paVar9->cardinality = iVar14;
    }
    return false;
  }
  pbVar8 = (bitset_container_t *)*dst;
  if (pbVar8 == src_2) {
    puVar17 = src_2->words;
    if ((int)uVar16 < 1) {
      *puVar17 = 0;
      uVar5 = 0;
      uVar16 = 0;
LAB_0010d89b:
      memset((void *)((long)puVar17 + (ulong)(uVar5 >> 3 & 0x1ff8) + 8),0,
             (ulong)(uVar16 * -8 + 0x1fe8) + 8);
      uVar12 = 0xffffffffffffffff;
    }
    else {
      uVar13 = 0;
      uVar5 = 0;
      do {
        uVar1 = prVar3[uVar13].value;
        uVar2 = prVar3[uVar13].length;
        if (uVar5 != uVar1) {
          uVar6 = uVar5 >> 6;
          uVar11 = -1L << ((byte)uVar5 & 0x3f);
          uVar16 = uVar1 - 1 >> 6;
          if (uVar16 - uVar6 == 0) {
            bVar10 = -(char)uVar1;
            uVar11 = (uVar11 << (bVar10 & 0x3f)) >> (bVar10 & 0x3f);
            uVar16 = uVar6;
          }
          else {
            puVar17[uVar6] = puVar17[uVar6] & ~uVar11;
            if (uVar6 + 1 < uVar16) {
              memset(puVar17 + (ulong)uVar6 + 1,0,(ulong)((uVar16 - uVar6) - 2) * 8 + 8);
            }
            uVar11 = 0xffffffffffffffff >> (-(char)uVar1 & 0x3fU);
          }
          puVar17[uVar16] = puVar17[uVar16] & ~uVar11;
        }
        uVar5 = (uint)uVar1 + (uint)uVar2 + 1;
        uVar13 = uVar13 + 1;
      } while (uVar12 != uVar13);
      if (uVar5 == 0x10000) goto LAB_0010d8d6;
      uVar16 = uVar5 >> 6;
      uVar12 = -1L << ((byte)uVar5 & 0x3f);
      if ((uVar16 != 0x3ff) &&
         (puVar17[uVar16] = puVar17[uVar16] & ~uVar12, uVar12 = 0xffffffffffffffff, uVar5 < 0xff80))
      goto LAB_0010d89b;
    }
    puVar17[0x3ff] = puVar17[0x3ff] & ~uVar12;
LAB_0010d8d6:
    iVar7 = bitset_container_compute_cardinality(pbVar8);
    pbVar8->cardinality = iVar7;
    if (src_2->cardinality < 0x1001) {
      paVar9 = array_container_from_bitset(src_2);
      *dst = paVar9;
      return false;
    }
    return true;
  }
  pbVar8 = bitset_container_clone(src_2);
  *dst = pbVar8;
  if (pbVar8 == (bitset_container_t *)0x0) {
    return true;
  }
  iVar7 = src_1->n_runs;
  if ((long)iVar7 < 1) {
    puVar17 = pbVar8->words;
    *puVar17 = 0;
    uVar5 = 0;
    uVar16 = 0;
LAB_0010d82b:
    memset((void *)((long)puVar17 + (ulong)(uVar5 >> 3 & 0x1ff8) + 8),0,
           (ulong)(uVar16 * -8 + 0x1fe8) + 8);
    uVar12 = 0xffffffffffffffff;
  }
  else {
    prVar3 = src_1->runs;
    puVar17 = pbVar8->words;
    lVar18 = 0;
    uVar5 = 0;
    do {
      uVar1 = prVar3[lVar18].value;
      uVar2 = prVar3[lVar18].length;
      if (uVar5 != uVar1) {
        uVar6 = uVar5 >> 6;
        uVar12 = -1L << ((byte)uVar5 & 0x3f);
        uVar16 = uVar1 - 1 >> 6;
        if (uVar16 - uVar6 == 0) {
          bVar10 = -(char)uVar1;
          uVar12 = (uVar12 << (bVar10 & 0x3f)) >> (bVar10 & 0x3f);
          uVar16 = uVar6;
        }
        else {
          puVar17[uVar6] = puVar17[uVar6] & ~uVar12;
          if (uVar6 + 1 < uVar16) {
            memset(puVar17 + (ulong)uVar6 + 1,0,(ulong)((uVar16 - uVar6) - 2) * 8 + 8);
          }
          uVar12 = 0xffffffffffffffff >> (-(char)uVar1 & 0x3fU);
        }
        puVar17[uVar16] = puVar17[uVar16] & ~uVar12;
      }
      uVar5 = (uint)uVar1 + (uint)uVar2 + 1;
      lVar18 = lVar18 + 1;
    } while (iVar7 != lVar18);
    if (uVar5 == 0x10000) goto LAB_0010d862;
    uVar16 = uVar5 >> 6;
    uVar12 = -1L << ((byte)uVar5 & 0x3f);
    if ((uVar16 != 0x3ff) &&
       (puVar17[uVar16] = puVar17[uVar16] & ~uVar12, uVar12 = 0xffffffffffffffff, uVar5 < 0xff80))
    goto LAB_0010d82b;
  }
  puVar17[0x3ff] = puVar17[0x3ff] & ~uVar12;
LAB_0010d862:
  iVar7 = bitset_container_compute_cardinality(pbVar8);
  pbVar8->cardinality = iVar7;
  if (iVar7 < 0x1001) {
    paVar9 = array_container_from_bitset(pbVar8);
    bitset_container_free((bitset_container_t *)*dst);
    *dst = paVar9;
    return false;
  }
  return true;
}

Assistant:

bool run_bitset_container_intersection(
    const run_container_t *src_1, const bitset_container_t *src_2,
    container_t **dst
){
    if (run_container_is_full(src_1)) {
        if (*dst != src_2) *dst = bitset_container_clone(src_2);
        return true;
    }
    int32_t card = run_container_cardinality(src_1);
    if (card <= DEFAULT_MAX_SIZE) {
        // result can only be an array (assuming that we never make a
        // RunContainer)
        if (card > src_2->cardinality) {
            card = src_2->cardinality;
        }
        array_container_t *answer = array_container_create_given_capacity(card);
        *dst = answer;
        if (*dst == NULL) {
            return false;
        }
        for (int32_t rlepos = 0; rlepos < src_1->n_runs; ++rlepos) {
            rle16_t rle = src_1->runs[rlepos];
            uint32_t endofrun = (uint32_t)rle.value + rle.length;
            for (uint32_t runValue = rle.value; runValue <= endofrun;
                 ++runValue) {
                answer->array[answer->cardinality] = (uint16_t)runValue;
                answer->cardinality +=
                    bitset_container_contains(src_2, runValue);
            }
        }
        return false;
    }
    if (*dst == src_2) {  // we attempt in-place
        bitset_container_t *answer = CAST_bitset(*dst);
        uint32_t start = 0;
        for (int32_t rlepos = 0; rlepos < src_1->n_runs; ++rlepos) {
            const rle16_t rle = src_1->runs[rlepos];
            uint32_t end = rle.value;
            bitset_reset_range(src_2->words, start, end);

            start = end + rle.length + 1;
        }
        bitset_reset_range(src_2->words, start, UINT32_C(1) << 16);
        answer->cardinality = bitset_container_compute_cardinality(answer);
        if (src_2->cardinality > DEFAULT_MAX_SIZE) {
            return true;
        } else {
            array_container_t *newanswer = array_container_from_bitset(src_2);
            if (newanswer == NULL) {
                *dst = NULL;
                return false;
            }
            *dst = newanswer;
            return false;
        }
    } else {  // no inplace
        // we expect the answer to be a bitmap (if we are lucky)
        bitset_container_t *answer = bitset_container_clone(src_2);

        *dst = answer;
        if (answer == NULL) {
            return true;
        }
        uint32_t start = 0;
        for (int32_t rlepos = 0; rlepos < src_1->n_runs; ++rlepos) {
            const rle16_t rle = src_1->runs[rlepos];
            uint32_t end = rle.value;
            bitset_reset_range(answer->words, start, end);
            start = end + rle.length + 1;
        }
        bitset_reset_range(answer->words, start, UINT32_C(1) << 16);
        answer->cardinality = bitset_container_compute_cardinality(answer);

        if (answer->cardinality > DEFAULT_MAX_SIZE) {
            return true;
        } else {
            array_container_t *newanswer = array_container_from_bitset(answer);
            bitset_container_free(CAST_bitset(*dst));
            if (newanswer == NULL) {
                *dst = NULL;
                return false;
            }
            *dst = newanswer;
            return false;
        }
    }
}